

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O3

bool __thiscall
database::Container::_IsValidFilterCriteriaForRawSelection
          (Container *this,impl_filter_type *filter_criteria)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
  pair;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
  local_68;
  
  p_Var2 = (filter_criteria->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(filter_criteria->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar5 = true;
  }
  else {
    p_Var4 = &(this->m_schema)._M_t._M_impl.super__Rb_tree_header;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
      ::pair(&local_68,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
              *)(p_Var2 + 1));
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
              ::find(&(this->m_schema)._M_t,&local_68.first);
      bVar5 = (_Rb_tree_header *)cVar1._M_node != p_Var4;
      std::
      vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>
      ::~vector(&local_68.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
        operator_delete(local_68.first._M_dataplus._M_p,
                        local_68.first.field_2._M_allocated_capacity + 1);
      }
    } while (((_Rb_tree_header *)cVar1._M_node != p_Var4) &&
            (p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2),
            (_Rb_tree_header *)p_Var2 != p_Var3));
  }
  return bVar5;
}

Assistant:

bool database::Container::_IsValidFilterCriteriaForRawSelection(const database::impl_filter_type& filter_criteria) const
{
  for(auto pair: filter_criteria)
    if(m_schema.find(pair.first) == m_schema.end())
      return false;
  return true;
}